

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void clean_mud(void)

{
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  DESCRIPTOR_DATA *pDVar4;
  CRow *pCVar5;
  char *pcVar6;
  DbConnection riftCore;
  DESCRIPTOR_DATA *d;
  CSQLInterface nSQL;
  CRow row;
  int cres;
  char tbuf [4608];
  char buf [4608];
  DESCRIPTOR_DATA *in_stack_ffffffffffffd910;
  undefined7 in_stack_ffffffffffffd918;
  undefined1 in_stack_ffffffffffffd91f;
  CHAR_DATA *in_stack_ffffffffffffd920;
  CHAR_DATA *pCVar7;
  CLogger *in_stack_ffffffffffffd930;
  undefined7 in_stack_ffffffffffffd938;
  undefined1 in_stack_ffffffffffffd93f;
  char *in_stack_ffffffffffffd940;
  undefined4 in_stack_ffffffffffffd948;
  undefined4 in_stack_ffffffffffffd94c;
  char *in_stack_ffffffffffffd950;
  CSQLInterface *in_stack_ffffffffffffd958;
  CSQLInterface *in_stack_ffffffffffffd9a0;
  int in_stack_ffffffffffffd9cc;
  CHAR_DATA *in_stack_ffffffffffffd9d0;
  char *in_stack_ffffffffffffda80;
  Config *in_stack_ffffffffffffda88;
  CSQLInterface local_2570;
  CRow local_2438;
  int local_240c;
  CHAR_DATA local_2408 [4];
  char *in_stack_ffffffffffffec30;
  DESCRIPTOR_DATA *in_stack_ffffffffffffec38;
  char local_1208 [4616];
  
  local_240c = 0;
  CSQLInterface::CSQLInterface(in_stack_ffffffffffffd9a0);
  Config::GetDbConnection(in_stack_ffffffffffffda88,in_stack_ffffffffffffda80);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  bVar1 = CSQLInterface::StartSQLServer
                    (in_stack_ffffffffffffd958,in_stack_ffffffffffffd950,
                     (char *)CONCAT44(in_stack_ffffffffffffd94c,in_stack_ffffffffffffd948),
                     in_stack_ffffffffffffd940,
                     (char *)CONCAT17(in_stack_ffffffffffffd93f,in_stack_ffffffffffffd938));
  if (bVar1) {
    sprintf(local_1208,"DELETE FROM logins WHERE ctime + 5184000 < %ld",current_time);
    one_query((char *)in_stack_ffffffffffffd910);
    sprintf(local_1208,"DELETE FROM notes WHERE timestamp + 2592000 < %ld",current_time);
    one_query((char *)in_stack_ffffffffffffd910);
    sprintf(local_1208,"DELETE FROM offerings WHERE time + 2592000 < %ld",current_time);
    one_query((char *)in_stack_ffffffffffffd910);
    sprintf(local_1208,"DELETE FROM pklogs WHERE ctime + 5184000 < %ld",current_time);
    one_query((char *)in_stack_ffffffffffffd910);
    local_240c = CSQLInterface::Select
                           (&RS.SQL,"name FROM players WHERE lastlogin + 2592000 < %ld",current_time
                           );
    if (local_240c != 0) {
      pDVar4 = new_descriptor();
      while (bVar1 = CSQLInterface::End(&RS.SQL), ((bVar1 ^ 0xffU) & 1) != 0) {
        pCVar5 = CSQLInterface::GetRow((CSQLInterface *)in_stack_ffffffffffffd910);
        local_2438.maxcol = pCVar5->maxcol;
        local_2438.maxrow = pCVar5->maxrow;
        local_2438.rowpos = pCVar5->rowpos;
        local_2438.row = pCVar5->row;
        pCVar7 = local_2408;
        pcVar6 = CRow::operator[](&local_2438,0);
        strcpy((char *)pCVar7,pcVar6);
        bVar1 = load_char_obj(in_stack_ffffffffffffec38,in_stack_ffffffffffffec30);
        if (bVar1) {
          pDVar4->character->desc = (DESCRIPTOR_DATA *)0x0;
          if (0x1d < pDVar4->character->level) {
            perm_death_log(in_stack_ffffffffffffd9d0,in_stack_ffffffffffffd9cc);
          }
          delete_char((char *)tbuf._3136_8_,(bool)tbuf[0xc3f]);
        }
        else {
          free_char(in_stack_ffffffffffffd920);
        }
      }
      free_descriptor(in_stack_ffffffffffffd910);
    }
    local_240c = CSQLInterface::Select(&RS.SQL);
    if (local_240c != 0) {
      pDVar4 = new_descriptor();
      while (uVar2 = CSQLInterface::End(&RS.SQL), ((uVar2 ^ 0xff) & 1) != 0) {
        pCVar5 = CSQLInterface::GetRow((CSQLInterface *)in_stack_ffffffffffffd910);
        local_2438.maxcol = pCVar5->maxcol;
        local_2438.maxrow = pCVar5->maxrow;
        local_2438.rowpos = pCVar5->rowpos;
        local_2438.row = pCVar5->row;
        pCVar7 = local_2408;
        pcVar6 = CRow::operator[](&local_2438,0);
        strcpy((char *)pCVar7,pcVar6);
        uVar3 = load_char_obj(in_stack_ffffffffffffec38,in_stack_ffffffffffffec30);
        if (!(bool)uVar3) {
          in_stack_ffffffffffffd910 = (DESCRIPTOR_DATA *)CRow::operator[](&local_2438,0);
          CSQLInterface::Delete(&local_2570,"players WHERE name = \'%s\'",in_stack_ffffffffffffd910)
          ;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)pCVar7,
                     (char *)CONCAT17(uVar3,in_stack_ffffffffffffd918));
          fmt_00._M_len._7_1_ = uVar2;
          fmt_00._M_len._0_7_ = in_stack_ffffffffffffd938;
          fmt_00._M_str = (char *)pDVar4;
          CLogger::Info<>((CLogger *)pCVar5,fmt_00);
        }
        free_char(pCVar7);
      }
      free_descriptor(in_stack_ffffffffffffd910);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffd920,
               (char *)CONCAT17(in_stack_ffffffffffffd91f,in_stack_ffffffffffffd918));
    fmt._M_len._7_1_ = in_stack_ffffffffffffd93f;
    fmt._M_len._0_7_ = in_stack_ffffffffffffd938;
    fmt._M_str = in_stack_ffffffffffffd940;
    CLogger::Error<>(in_stack_ffffffffffffd930,fmt);
  }
  DbConnection::~DbConnection((DbConnection *)in_stack_ffffffffffffd910);
  CSQLInterface::~CSQLInterface((CSQLInterface *)in_stack_ffffffffffffd910);
  return;
}

Assistant:

void clean_mud()
{
	char buf[MSL], tbuf[MSL];
	int cres = 0;
	CRow row;
	CSQLInterface nSQL;
	DESCRIPTOR_DATA *d;

	DbConnection riftCore = nSQL.Settings.GetDbConnection("rift");
	if (!nSQL.StartSQLServer(riftCore.Host.c_str(),
		riftCore.Db.c_str(), riftCore.User.c_str(), riftCore.Pwd.c_str()))
	{
		RS.Logger.Error("clean_mud: failed to establish a database connection.");
		return;
	}

	// 5184000 = one month

	sprintf(buf, "DELETE FROM logins WHERE ctime + 5184000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM notes WHERE timestamp + 2592000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM offerings WHERE time + 2592000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM pklogs WHERE ctime + 5184000 < %ld", current_time);
	one_query(buf);

	// autodelete...
	cres = RS.SQL.Select("name FROM players WHERE lastlogin + 2592000 < %ld", current_time);

	if (cres)
	{
		d = new_descriptor();

		while (!RS.SQL.End())
		{
			row = RS.SQL.GetRow();
			strcpy(&tbuf[0], row[0]);

			if (!load_char_obj(d, tbuf))
			{
				free_char(d->character);
				continue;
			}

			d->character->desc = nullptr;

			if (d->character->level >= 30)
				perm_death_log(d->character, 4);

			delete_char(d->character->true_name, true);
		}

		free_descriptor(d);
	}

	// compare db to pfiles
	cres = RS.SQL.Select("name FROM players");

	if (cres)
	{
		d = new_descriptor();

		while (!RS.SQL.End())
		{
			row = RS.SQL.GetRow();
			strcpy(&tbuf[0], row[0]);

			if (!load_char_obj(d, tbuf))
			{
				nSQL.Delete("players WHERE name = '%s'", row[0]);
				RS.Logger.Info("Deleting player...");
			}

			free_char(d->character);
		}

		free_descriptor(d);
	}
}